

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidget::setHorizontalHeaderLabels(QTableWidget *this,QStringList *labels)

{
  int iVar1;
  QTableModel *pQVar2;
  qsizetype qVar3;
  QList<QString> *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int i;
  QTableWidgetItem *item;
  QTableModel *model;
  QTableWidgetPrivate *d;
  QTableWidgetItem *in_stack_ffffffffffffff88;
  int section;
  QTableModel *in_stack_ffffffffffffff90;
  QTableModel *this_00;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  int iVar5;
  QTableWidgetItem *local_48;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTableWidget *)0x8dacbf);
  pQVar2 = QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dacce);
  iVar4 = 0;
  while( true ) {
    section = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    this_00 = pQVar2;
    iVar5 = iVar4;
    QModelIndex::QModelIndex((QModelIndex *)0x8dad00);
    iVar1 = (**(code **)(*(long *)this_00 + 0x80))(this_00,local_20);
    in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
    if (iVar4 < iVar1) {
      in_stack_ffffffffffffff90 = (QTableModel *)(long)iVar5;
      qVar3 = QList<QString>::size(in_RSI);
      in_stack_ffffffffffffffa4 =
           CONCAT13((long)in_stack_ffffffffffffff90 < qVar3,(int3)in_stack_ffffffffffffffa4);
    }
    if ((char)(in_stack_ffffffffffffffa4 >> 0x18) == '\0') break;
    local_48 = QTableModel::horizontalHeaderItem(in_stack_ffffffffffffff90,section);
    if (local_48 == (QTableWidgetItem *)0x0) {
      local_48 = QTableModel::createItem((QTableModel *)CONCAT44(in_stack_ffffffffffffffa4,iVar4));
      setHorizontalHeaderItem
                ((QTableWidget *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                 (int)((ulong)in_RDI >> 0x20),
                 (QTableWidgetItem *)CONCAT44(in_stack_ffffffffffffffa4,iVar4));
    }
    QList<QString>::at((QList<QString> *)in_stack_ffffffffffffff90,(qsizetype)local_48);
    QTableWidgetItem::setText((QTableWidgetItem *)this_00,(QString *)in_stack_ffffffffffffff90);
    iVar4 = iVar5 + 1;
    in_stack_ffffffffffffff88 = local_48;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::setHorizontalHeaderLabels(const QStringList &labels)
{
    Q_D(QTableWidget);
    QTableModel *model = d->tableModel();
    QTableWidgetItem *item = nullptr;
    for (int i = 0; i < model->columnCount() && i < labels.size(); ++i) {
        item = model->horizontalHeaderItem(i);
        if (!item) {
            item = model->createItem();
            setHorizontalHeaderItem(i, item);
        }
        item->setText(labels.at(i));
    }
}